

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<char>::assign<char_const*,q20::identity>
          (QArrayDataPointer<char> *this,char *first,char *last)

{
  char *__src;
  char *pcVar1;
  long lVar2;
  qsizetype capacity;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  pair<QTypedArrayData<char>_*,_char_*> pVar7;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = this->d;
  if (((pDVar3 == (Data *)0x0) ||
      (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar3->super_QArrayData).alloc < (long)last - (long)first)) {
    capacity = detachCapacity(this,(long)last - (long)first);
    pVar7 = QTypedArrayData<char>::allocate(capacity,KeepSize);
    local_58.d = this->d;
    local_58.ptr = this->ptr;
    this->d = pVar7.first;
    this->ptr = pVar7.second;
    local_58.size = this->size;
    this->size = 0;
    ~QArrayDataPointer(&local_58);
    pDVar3 = this->d;
  }
  pcVar1 = this->ptr;
  lVar4 = (long)pcVar1 -
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
  if (pDVar3 == (Data *)0x0) {
    lVar4 = 0;
  }
  lVar2 = this->size;
  pcVar6 = pcVar1 + -lVar4;
  if (lVar4 != 0) {
    this->ptr = pcVar1 + -lVar4;
    for (lVar5 = -lVar4; lVar5 != 0; lVar5 = lVar5 + 1) {
      if (first == last) {
        pcVar6 = pcVar1 + lVar5;
        goto LAB_0020ee91;
      }
      pcVar1[lVar5] = *first;
      first = first + 1;
    }
    this->size = this->size + lVar4;
    pcVar6 = pcVar1;
  }
  lVar4 = 0;
  do {
    __src = first + lVar4;
    if (__src == last) {
LAB_0020ee91:
      this->size = (long)pcVar6 - (long)this->ptr;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    if (lVar4 == lVar2) {
      memmove(pcVar1 + lVar2,__src,(size_t)(last + (-lVar4 - (long)first)));
      pcVar6 = pcVar1 + (long)(last + ((lVar2 - (long)first) - lVar4));
      goto LAB_0020ee91;
    }
    *pcVar6 = *__src;
    pcVar6 = pcVar6 + 1;
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void assign(InputIterator first, InputIterator last, Projection proj = {})
    {
        // This function only provides the basic exception guarantee.
        constexpr bool IsFwdIt = std::is_convertible_v<
                typename std::iterator_traits<InputIterator>::iterator_category,
                std::forward_iterator_tag>;
        constexpr bool IsIdentity = std::is_same_v<Projection, q20::identity>;

        if constexpr (IsFwdIt) {
            const qsizetype n = std::distance(first, last);
            if (needsDetach() || n > constAllocatedCapacity()) {
                QArrayDataPointer allocated(detachCapacity(n));
                swap(allocated);
            }
        } else if (needsDetach()) {
            QArrayDataPointer allocated(allocatedCapacity());
            swap(allocated);
            // We don't want to copy data that we know we'll overwrite
        }

        auto offset = freeSpaceAtBegin();
        const auto capacityBegin = begin() - offset;
        const auto prependBufferEnd = begin();

        if constexpr (!std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
            // If construction can throw, and we have freeSpaceAtBegin(),
            // it's easiest to just clear the container and start fresh.
            // The alternative would be to keep track of two active, disjoint ranges.
            if (offset) {
                (*this)->truncate(0);
                setBegin(capacityBegin);
                offset = 0;
            }
        }

        auto dst = capacityBegin;
        const auto dend = end();
        if (offset) { // avoids dead stores
            setBegin(capacityBegin); // undo prepend optimization

            // By construction, the following loop is nothrow!
            // (otherwise, we can't reach here)
            // Assumes InputIterator operations don't throw.
            // (but we can't statically assert that, as these operations
            //  have preconditons, so typically aren't noexcept)
            while (true) {
                if (dst == prependBufferEnd) {  // ran out of prepend buffer space
                    size += offset;
                    // we now have a contiguous buffer, continue with the main loop:
                    break;
                }
                if (first == last) {            // ran out of elements to assign
                    std::destroy(prependBufferEnd, dend);
                    size = dst - begin();
                    return;
                }
                // construct element in prepend buffer
                q20::construct_at(dst, std::invoke(proj, *first));
                ++dst;
                ++first;
            }
        }

        while (true) {
            if (first == last) {    // ran out of elements to assign
                std::destroy(dst, dend);
                break;
            }
            if (dst == dend) {      // ran out of existing elements to overwrite
                if constexpr (IsFwdIt && IsIdentity) {
                    dst = std::uninitialized_copy(first, last, dst);
                    break;
                } else if constexpr (IsFwdIt && !IsIdentity
                           && std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
                    for (; first != last; ++dst, ++first)   // uninitialized_copy with projection
                        q20::construct_at(dst, std::invoke(proj, *first));
                    break;
                } else {
                    do {
                        (*this)->emplace(size, std::invoke(proj, *first));
                    } while (++first != last);
                    return;         // size() is already correct (and dst invalidated)!
                }
            }
            *dst = std::invoke(proj, *first);    // overwrite existing element
            ++dst;
            ++first;
        }
        size = dst - begin();
    }